

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate-license.cpp
# Opt level: O0

string * license::test::sign_data(string *__return_storage_ptr__,string *data,string *test_name)

{
  unit_test_log_t *puVar1;
  bool bVar2;
  int iVar3;
  lazy_ostream *plVar4;
  string *psVar5;
  char *pcVar6;
  ostream *poVar7;
  istreambuf_iterator<char,_std::char_traits<char>_> __beg;
  istreambuf_iterator<char,_std::char_traits<char>_> __end;
  allocator<char> local_661;
  undefined1 local_660 [12];
  undefined1 local_650 [12];
  undefined1 local_639;
  istream_type local_638 [8];
  ifstream ifs;
  undefined4 local_42c;
  basic_cstring<const_char> local_428;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_418;
  basic_cstring<const_char> local_3f0;
  basic_cstring<const_char> local_3e0;
  string local_3d0 [36];
  int local_3ac;
  string local_3a8 [4];
  int retCode;
  stringstream local_388 [8];
  stringstream ss;
  ostream local_378 [376];
  string local_200 [8];
  string output_file_s;
  path local_1c0;
  path local_1a0;
  undefined1 local_180 [8];
  path outputFile;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_130;
  assertion_result local_110;
  basic_cstring<const_char> local_f8;
  basic_cstring<const_char> local_e8;
  undefined1 local_d8 [8];
  path licenses_base;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[181],_const_char_(&)[181]> local_a8;
  assertion_result local_88;
  basic_cstring<const_char> local_70 [2];
  basic_cstring<const_char> local_50;
  undefined1 local_40 [8];
  path lcc_exe;
  string *test_name_local;
  string *data_local;
  string *content;
  
  lcc_exe.m_pathname.field_2._8_8_ = test_name;
  boost::filesystem::path::path
            ((path *)local_40,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/build_O0/extern/license-generator/src/license_generator/lccgen"
            );
  do {
    puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_50,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/functional/generate-license.cpp"
               ,0x7d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(local_70);
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_50,0x3f,local_70);
    bVar2 = boost::filesystem::is_regular_file((path *)local_40);
    boost::test_tools::assertion_result::assertion_result(&local_88,bVar2);
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              (&local_a8,plVar4,
               (char (*) [181])
               "License generator not found: /workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/build_O0/extern/license-generator/src/license_generator/lccgen"
              );
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)((long)&licenses_base.m_pathname.field_2 + 8),
               "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/functional/generate-license.cpp"
               ,0x7d);
    boost::test_tools::tt_detail::report_assertion
              (&local_88,&local_a8,(undefined1 *)((long)&licenses_base.m_pathname.field_2 + 8),0x3f,
               2,1,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[181],_const_char_(&)[181]>::
    ~lazy_ostream_impl(&local_a8);
    boost::test_tools::assertion_result::~assertion_result(&local_88);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  boost::filesystem::path::path
            ((path *)local_d8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/build_O0/Testing/Temporary/DEFAULT/licenses"
            );
  bVar2 = boost::filesystem::exists((path *)local_d8);
  if (!bVar2) {
    do {
      puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_e8,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/functional/generate-license.cpp"
                 ,0x7d);
      boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_f8);
      boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_e8,0x42,&local_f8);
      bVar2 = boost::filesystem::create_directories((path *)local_d8);
      boost::test_tools::assertion_result::assertion_result(&local_110,bVar2);
      plVar4 = boost::unit_test::lazy_ostream::instance();
      psVar5 = boost::filesystem::path::string_abi_cxx11_((path *)local_d8);
      std::operator+(&local_150,"test folders created ",psVar5);
      boost::unit_test::operator<<(&local_130,plVar4,&local_150);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)((long)&outputFile.m_pathname.field_2 + 8),
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/functional/generate-license.cpp"
                 ,0x7d);
      boost::test_tools::tt_detail::report_assertion
                (&local_110,&local_130,(undefined1 *)((long)&outputFile.m_pathname.field_2 + 8),0x42
                 ,2,1,0);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
      ::~lazy_ostream_impl(&local_130);
      std::__cxx11::string::~string((string *)&local_150);
      boost::test_tools::assertion_result::~assertion_result(&local_110);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
  }
  boost::filesystem::path::path
            (&local_1a0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/build_O0/Testing/Temporary"
            );
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&output_file_s.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 lcc_exe.m_pathname.field_2._8_8_,".tmp");
  boost::filesystem::path::path(&local_1c0,(string_type *)((long)&output_file_s.field_2 + 8));
  boost::filesystem::operator/((path *)local_180,&local_1a0,&local_1c0);
  boost::filesystem::path::~path(&local_1c0);
  std::__cxx11::string::~string((string *)(output_file_s.field_2._M_local_buf + 8));
  boost::filesystem::path::~path(&local_1a0);
  psVar5 = boost::filesystem::path::string_abi_cxx11_((path *)local_180);
  std::__cxx11::string::string(local_200,(string *)psVar5);
  pcVar6 = (char *)std::__cxx11::string::c_str();
  remove(pcVar6);
  std::__cxx11::stringstream::stringstream(local_388);
  poVar7 = std::operator<<(local_378,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/build_O0/extern/license-generator/src/license_generator/lccgen"
                          );
  std::operator<<(poVar7," test sign");
  poVar7 = std::operator<<(local_378," --primary-key ");
  std::operator<<(poVar7,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/projects/DEFAULT/private_key.rsa"
                 );
  poVar7 = std::operator<<(local_378," -d ");
  std::operator<<(poVar7,(string *)data);
  poVar7 = std::operator<<(local_378," -o ");
  std::operator<<(poVar7,local_200);
  poVar7 = std::operator<<((ostream *)std::cout,"executing :");
  std::__cxx11::stringstream::str();
  poVar7 = std::operator<<(poVar7,local_3a8);
  std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_3a8);
  std::__cxx11::stringstream::str();
  pcVar6 = (char *)std::__cxx11::string::c_str();
  iVar3 = system(pcVar6);
  std::__cxx11::string::~string(local_3d0);
  local_3ac = iVar3;
  do {
    puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_3e0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/functional/generate-license.cpp"
               ,0x7d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_3f0);
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_3e0,0x51,&local_3f0);
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_418,plVar4,(char (*) [1])"");
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_428,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/functional/generate-license.cpp"
               ,0x7d);
    local_42c = 0;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_418,&local_428,0x51,1,2,&local_3ac,"retCode",&local_42c,"0");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_418);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  bVar2 = boost::filesystem::exists((path *)local_180);
  if (!bVar2) {
    __assert_fail("fs::exists(outputFile)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/functional/generate-license.cpp"
                  ,0x52,"string license::test::sign_data(const string &, const string &)");
  }
  pcVar6 = (char *)std::__cxx11::string::c_str();
  std::ifstream::ifstream(local_638,pcVar6,_S_in);
  local_639 = 0;
  std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
            ((istreambuf_iterator<char,_std::char_traits<char>_> *)local_650,local_638);
  std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
            ((istreambuf_iterator<char,_std::char_traits<char>_> *)local_660);
  std::allocator<char>::allocator();
  __beg._12_4_ = 0;
  __beg._M_sbuf = (streambuf_type *)local_650._0_8_;
  __beg._M_c = local_650._8_4_;
  __end._12_4_ = 0;
  __end._M_sbuf = (streambuf_type *)local_660._0_8_;
  __end._M_c = local_660._8_4_;
  std::__cxx11::string::string<std::istreambuf_iterator<char,std::char_traits<char>>,void>
            ((string *)__return_storage_ptr__,__beg,__end,&local_661);
  std::allocator<char>::~allocator(&local_661);
  local_639 = 1;
  std::ifstream::~ifstream(local_638);
  std::__cxx11::stringstream::~stringstream(local_388);
  std::__cxx11::string::~string(local_200);
  boost::filesystem::path::~path((path *)local_180);
  boost::filesystem::path::~path((path *)local_d8);
  boost::filesystem::path::~path((path *)local_40);
  return __return_storage_ptr__;
}

Assistant:

string sign_data(const string& data, const string& test_name) {
	fs::path lcc_exe(LCC_EXE);
	BOOST_REQUIRE_MESSAGE(fs::is_regular_file(lcc_exe), "License generator not found: " LCC_EXE);
	fs::path licenses_base(LCC_LICENSES_BASE);
	if (!fs::exists(licenses_base)) {
		BOOST_REQUIRE_MESSAGE(fs::create_directories(licenses_base), "test folders created " + licenses_base.string());
	}

	const fs::path outputFile(fs::path(PROJECT_TEST_TEMP_DIR) / (test_name + ".tmp"));
	const string output_file_s = outputFile.string();
	remove(output_file_s.c_str());

	stringstream ss;
	ss << LCC_EXE << " test sign";
	ss << " --" PARAM_PRIMARY_KEY " " << LCC_PROJECT_PRIVATE_KEY;
	ss << " -d " << data;
	ss << " -o " << output_file_s;

	cout << "executing :" << ss.str() << endl;
	const int retCode = std::system(ss.str().c_str());
	BOOST_CHECK_EQUAL(retCode, 0);
	BOOST_ASSERT(fs::exists(outputFile));
	std::ifstream ifs(output_file_s.c_str());
	std::string content((std::istreambuf_iterator<char>(ifs)), (std::istreambuf_iterator<char>()));
	return content;
}